

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbtree.c
# Opt level: O1

rb_result_t rb_tree_empty(rb_tree *tree,int *is_empty)

{
  bool bVar1;
  int iVar2;
  rb_tree_node *prVar3;
  long extraout_RDX;
  rb_tree_node *node;
  rb_tree_node *unaff_RBX;
  rb_result_t rVar4;
  rb_tree *unaff_R14;
  rb_tree_node *prVar5;
  rb_result_t rStack_14;
  
  if (tree == (rb_tree *)0x0) {
    rb_tree_empty_cold_2();
  }
  else if (is_empty != (int *)0x0) {
    *is_empty = (uint)(tree->root == (rb_tree_node *)0x0);
    return 0;
  }
  rb_tree_empty_cold_1();
  if (tree == (rb_tree *)0x0) {
    rb_tree_find_cold_3();
  }
  else if (extraout_RDX != 0) {
    rb_tree_find_cold_1();
    return rStack_14;
  }
  rb_tree_find_cold_2();
  if (tree == (rb_tree *)0x0) {
    rb_tree_insert_cold_2();
  }
  else {
    unaff_RBX = node;
    if (node != (rb_tree_node *)0x0) {
      node->left = (rb_tree_node *)0x0;
      node->right = (rb_tree_node *)0x0;
      node->parent = (rb_tree_node *)0x0;
      node->key = is_empty;
      prVar5 = tree->root;
      unaff_R14 = tree;
      if (prVar5 != (rb_tree_node *)0x0) {
        node->color = 1;
        bVar1 = true;
        rVar4 = 0;
        do {
          iVar2 = (*tree->compare)(tree->state,node->key,prVar5->key);
          if (iVar2 == 0) {
            iVar2 = 6;
            rVar4 = 3;
            prVar3 = prVar5;
          }
          else if (iVar2 < 0) {
            bVar1 = false;
            prVar3 = prVar5;
            if (prVar5->left == (rb_tree_node *)0x0) goto LAB_00114e68;
            iVar2 = 0;
            prVar3 = prVar5->left;
          }
          else {
            prVar3 = prVar5->right;
            iVar2 = 0;
            if (prVar3 == (rb_tree_node *)0x0) {
              prVar3 = (rb_tree_node *)&prVar5->right;
LAB_00114e68:
              prVar3->left = node;
              iVar2 = 8;
              prVar3 = prVar5;
            }
          }
          prVar5 = prVar3;
          if (iVar2 != 0) {
            if (iVar2 != 8) {
              return rVar4;
            }
            node->parent = prVar3;
            if (bVar1) {
              tree->rightmost = node;
            }
            __helper_rb_tree_insert_rebalance(tree,node);
            return rVar4;
          }
        } while( true );
      }
      goto LAB_00114ea7;
    }
  }
  rb_tree_insert_cold_1();
LAB_00114ea7:
  unaff_R14->root = unaff_RBX;
  unaff_R14->rightmost = unaff_RBX;
  unaff_RBX->color = 0;
  return 0;
}

Assistant:

rb_result_t rb_tree_empty(struct rb_tree *tree,
                          int *is_empty)
{
    rb_result_t ret = RB_OK;

    RB_ASSERT_ARG(tree != NULL);
    RB_ASSERT_ARG(is_empty != NULL);

    *is_empty = !!(tree->root == NULL);

    return ret;
}